

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VDotProdLocal(N_Vector X,N_Vector Y,sunindextype param_3,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double val;
  undefined8 uVar5;
  double dVar6;
  timespec spec;
  timespec local_38;
  
  val = (double)myid;
  set_element_range(X,0,param_3 + -1,val);
  set_element_range(Y,0,param_3 + -1,1.0 / (double)param_3);
  iVar4 = 1;
  clock_gettime(1,&local_38);
  lVar2 = local_38.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_38.tv_nsec;
  uVar5 = N_VDotProdLocal(X,Y);
  sync_device(X);
  clock_gettime(1,&local_38);
  lVar3 = local_38.tv_sec - base_time_tv_sec;
  iVar1 = SUNRCompareTol(uVar5,val,0x3e50000000000000);
  if (iVar1 == 0) {
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdLocal");
    }
    iVar4 = 0;
  }
  else {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n",(ulong)(uint)myid);
    printf("ans = %.17f expected = %.17f\n",uVar5,val);
  }
  max_time(X,((double)local_38.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar6 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdLocal");
  }
  return iVar4;
}

Assistant:

int Test_N_VDotProdLocal(N_Vector X, N_Vector Y, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, rmyid, locleninv;

  /* fill vector data */
  rmyid     = (sunrealtype)myid;
  locleninv = ONE / local_length;
  set_element_range(X, 0, local_length - 1, rmyid);
  set_element_range(Y, 0, local_length - 1, locleninv);

  start_time = get_time();
  ans        = N_VDotProdLocal(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal rmyid */
  failure = SUNRCompareTol(ans, rmyid, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdLocal, Proc %d\n", myid);
    printf("ans = %" FSYM " expected = %" FSYM "\n", ans, rmyid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProdLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdLocal", maxt);

  return (fails);
}